

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar_pidd.hpp
# Opt level: O0

void __thiscall astar_pidd::AStarPIDD<Tiles>::AStarPIDD(AStarPIDD<Tiles> *this,Tiles *d)

{
  ostream *poVar1;
  Tiles *in_RSI;
  SearchAlg<Tiles> *in_RDI;
  size_t in_stack_00000110;
  bool in_stack_0000011d;
  bool in_stack_0000011e;
  bool in_stack_0000011f;
  CompressClosedListAsync<Node<Tiles>_> *in_stack_00000120;
  unsigned_long_long in_stack_ffffffffffffffc0;
  
  SearchAlg<Tiles>::SearchAlg(in_RDI,in_RSI);
  in_RDI->_vptr_SearchAlg = (_func_int **)&PTR_search_0014aa00;
  compunits::operator____MiB(in_stack_ffffffffffffffc0);
  compress::CompressClosedListAsync<Node<Tiles>_>::CompressClosedListAsync
            (in_stack_00000120,in_stack_0000011f,in_stack_0000011e,in_stack_0000011d,
             in_stack_00000110);
  compress::CompressOpenList<Node<Tiles>_>::CompressOpenList
            ((CompressOpenList<Node<Tiles>_> *)0x1074e0);
  std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
            ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)0x1074f7);
  in_RDI[9]._vptr_SearchAlg = (_func_int **)0x0;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x20);
  std::operator<<(poVar1," concurrent threads are supported.\n");
  return;
}

Assistant:

AStarPIDD(Domain &d) : SearchAlg<Domain>(d),
            closed(true, true, true, 950_MiB), // TODO: move to user option
            open() {
            std::cout << N_THREADS << " concurrent threads are supported.\n";
        }